

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O0

void __thiscall
SightCheck::P_SightOpening
          (SightCheck *this,SightOpening *open,line_t_conflict *linedef,double x,double y)

{
  sector_t_conflict *this_00;
  sector_t_conflict *this_01;
  bool bVar1;
  double dVar2;
  double local_60;
  double bf;
  double bc;
  double ff;
  double fc;
  sector_t_conflict *back;
  sector_t_conflict *front;
  double y_local;
  double x_local;
  line_t_conflict *linedef_local;
  SightOpening *open_local;
  SightCheck *this_local;
  
  open->portalflags = 0;
  this_00 = linedef->frontsector;
  this_01 = linedef->backsector;
  if (this_01 == (sector_t_conflict *)0x0) {
    if ((linedef->flags & 0x80000000) != 0) {
      bVar1 = sector_t::PortalBlocksSight((sector_t *)this_00,1);
      if (!bVar1) {
        open->portalflags = open->portalflags | 1;
      }
      bVar1 = sector_t::PortalBlocksSight((sector_t *)this_00,0);
      if (!bVar1) {
        open->portalflags = open->portalflags | 4;
      }
    }
    open->range = 0;
  }
  else {
    ff = 0.0;
    bc = 0.0;
    bf = 0.0;
    local_60 = 0.0;
    if ((linedef->flags & 0x80000000) != 0) {
      bVar1 = sector_t::PortalBlocksSight((sector_t *)this_00,1);
      if (!bVar1) {
        ff = 3.4028234663852886e+38;
        open->portalflags = open->portalflags | 1;
      }
      bVar1 = sector_t::PortalBlocksSight((sector_t *)this_01,1);
      if (!bVar1) {
        bf = 3.4028234663852886e+38;
        open->portalflags = open->portalflags | 2;
      }
      bVar1 = sector_t::PortalBlocksSight((sector_t *)this_00,0);
      if (!bVar1) {
        bc = -3.4028234663852886e+38;
        open->portalflags = open->portalflags | 4;
      }
      bVar1 = sector_t::PortalBlocksSight((sector_t *)this_01,0);
      if (!bVar1) {
        local_60 = -3.4028234663852886e+38;
        open->portalflags = open->portalflags | 8;
      }
    }
    if ((ff == 0.0) && (!NAN(ff))) {
      ff = secplane_t::ZatPoint(&this_00->ceilingplane,x,y);
    }
    if ((bf == 0.0) && (!NAN(bf))) {
      bf = secplane_t::ZatPoint(&this_01->ceilingplane,x,y);
    }
    if ((bc == 0.0) && (!NAN(bc))) {
      bc = secplane_t::ZatPoint(&this_00->floorplane,x,y);
    }
    if ((local_60 == 0.0) && (!NAN(local_60))) {
      local_60 = secplane_t::ZatPoint(&this_01->floorplane,x,y);
    }
    dVar2 = MAX<double>(bc,local_60);
    open->bottom = dVar2;
    dVar2 = MIN<double>(ff,bf);
    open->top = dVar2;
    open->range = (uint)(open->bottom < open->top);
  }
  return;
}

Assistant:

void SightCheck::P_SightOpening(SightOpening &open, const line_t *linedef, double x, double y)
{
	open.portalflags = 0;
	sector_t *front = linedef->frontsector;
	sector_t *back = linedef->backsector;

	if (back == NULL)
	{
		// single sided line
		if (linedef->flags & ML_PORTALCONNECT)
		{
			if (!front->PortalBlocksSight(sector_t::ceiling)) open.portalflags |= SO_TOPFRONT;
			if (!front->PortalBlocksSight(sector_t::floor)) open.portalflags |= SO_BOTTOMFRONT;
		}

		open.range = 0;
		return;
	}


	double fc = 0, ff = 0, bc = 0, bf = 0;

	if (linedef->flags & ML_PORTALCONNECT)
	{
		if (!front->PortalBlocksSight(sector_t::ceiling)) fc = LINEOPEN_MAX, open.portalflags |= SO_TOPFRONT;
		if (!back->PortalBlocksSight(sector_t::ceiling)) bc = LINEOPEN_MAX, open.portalflags |= SO_TOPBACK;
		if (!front->PortalBlocksSight(sector_t::floor)) ff = LINEOPEN_MIN, open.portalflags |= SO_BOTTOMFRONT;
		if (!back->PortalBlocksSight(sector_t::floor)) bf = LINEOPEN_MIN, open.portalflags |= SO_BOTTOMBACK;
	}

	if (fc == 0) fc = front->ceilingplane.ZatPoint(x, y);
	if (bc == 0) bc = back->ceilingplane.ZatPoint(x, y);
	if (ff == 0) ff = front->floorplane.ZatPoint(x, y);
	if (bf == 0) bf = back->floorplane.ZatPoint(x, y);

	open.bottom = MAX(ff, bf);
	open.top = MIN(fc, bc);

	// we only want to know if there is an opening, not how large it is.
	open.range = open.bottom < open.top;
}